

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O3

int lws_h2_settings(lws *wsi,http2_settings *settings,uchar *buf,int len)

{
  byte bVar1;
  int iVar2;
  bool bVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  lws *wsi_00;
  char *reason;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  lws *wsi_01;
  
  wsi_00 = lws_get_network_wsi(wsi);
  if (len == 0) {
    uVar7 = 0;
  }
  else {
    uVar7 = 1;
    if (5 < len) {
      do {
        uVar4 = *(ushort *)buf << 8 | *(ushort *)buf >> 8;
        if (0xfffffff7 < uVar4 - 9) {
          bVar1 = (byte)*(ushort *)((long)buf + 2);
          uVar8 = (uint)*(byte *)((long)buf + 5) | (uint)*(byte *)((long)buf + 3) << 0x10 |
                  (uint)(byte)*(ushort *)((long)buf + 4) << 8 | (uint)bVar1 << 0x18;
          uVar9 = (uint)uVar4;
          uVar7 = uVar8;
          if (uVar4 == 5) {
            if (uVar8 < (((wsi->a).vhost)->h2).set.s[5]) {
              reason = "Frame size < initial";
LAB_00123e9a:
              lws_h2_goaway(wsi_00,1,reason);
              return 1;
            }
            if (bVar1 != 0) {
              reason = "Settings Frame size above max";
              goto LAB_00123e9a;
            }
          }
          else if (uVar4 == 4) {
            if ((int)((uint)bVar1 << 0x18) < 0) {
              lws_h2_goaway(wsi_00,3,"Inital Window beyond max");
              return 1;
            }
            if (((wsi->flags & 0x40) == 0) || (uVar7 = 0x7ffffff, uVar8 != 0x7fffffff)) {
              for (wsi_01 = (wsi_00->mux).child_list; uVar7 = uVar8, wsi_01 != (lws *)0x0;
                  wsi_01 = (wsi_01->mux).sibling_list) {
                uVar7 = (wsi_01->txc).tx_cr;
                _lws_log(8,"%s: adi child tc cr %d +%d -> %d","lws_h2_settings",(ulong)uVar7,
                         (ulong)(uVar8 - settings->s[4]),(ulong)((uVar7 + uVar8) - settings->s[4]));
                iVar5 = uVar8 - settings->s[4];
                iVar2 = (wsi_01->txc).tx_cr;
                iVar6 = iVar5 + (wsi_01->txc).tx_cr;
                (wsi_01->txc).tx_cr = iVar6;
                if ((iVar6 != 0 && SCARRY4(iVar5,iVar2) == iVar6 < 0) &&
                   (iVar6 <= (int)(uVar8 - settings->s[4]))) {
                  lws_callback_on_writable(wsi_01);
                }
              }
            }
          }
          else if ((uVar9 == 2) && (1 < uVar8)) {
            reason = "ENABLE_PUSH invalid arg";
            goto LAB_00123e9a;
          }
          settings->s[uVar9] = uVar7;
          _lws_log(8,"http2 settings %d <- 0x%x\n",(ulong)uVar9);
        }
        iVar2 = len + -6;
        buf = (uchar *)((long)buf + 6);
        bVar3 = 0xb < len;
        len = iVar2;
      } while (bVar3);
      uVar7 = (uint)(iVar2 != 0);
    }
  }
  return uVar7;
}

Assistant:

int
lws_h2_settings(struct lws *wsi, struct http2_settings *settings,
		unsigned char *buf, int len)
{
	struct lws *nwsi = lws_get_network_wsi(wsi);
	unsigned int a, b;

	if (!len)
		return 0;

	if (len < LWS_H2_SETTINGS_LEN)
		return 1;

	while (len >= LWS_H2_SETTINGS_LEN) {
		a = (unsigned int)((buf[0] << 8) | buf[1]);
		if (!a || a >= H2SET_COUNT)
			goto skip;
		b = (unsigned int)(buf[2] << 24 | buf[3] << 16 | buf[4] << 8 | buf[5]);

		switch (a) {
		case H2SET_HEADER_TABLE_SIZE:
			break;
		case H2SET_ENABLE_PUSH:
			if (b > 1) {
				lws_h2_goaway(nwsi, H2_ERR_PROTOCOL_ERROR,
					      "ENABLE_PUSH invalid arg");
				return 1;
			}
			break;
		case H2SET_MAX_CONCURRENT_STREAMS:
			break;
		case H2SET_INITIAL_WINDOW_SIZE:
			if (b > 0x7fffffff) {
				lws_h2_goaway(nwsi, H2_ERR_FLOW_CONTROL_ERROR,
					      "Inital Window beyond max");
				return 1;
			}

#if defined(LWS_WITH_CLIENT)
#if defined(LWS_AMAZON_RTOS) || defined(LWS_AMAZON_LINUX)
			if (
#else
			if (wsi->flags & LCCSCF_H2_QUIRK_OVERFLOWS_TXCR &&
#endif
			    b == 0x7fffffff) {
				b >>= 4;

				break;
			}
#endif

			/*
			 * In addition to changing the flow-control window for
			 * streams that are not yet active, a SETTINGS frame
			 * can alter the initial flow-control window size for
			 * streams with active flow-control windows (that is,
			 * streams in the "open" or "half-closed (remote)"
			 * state).  When the value of
			 * SETTINGS_INITIAL_WINDOW_SIZE changes, a receiver
			 * MUST adjust the size of all stream flow-control
			 * windows that it maintains by the difference between
			 * the new value and the old value.
			 */

			lws_start_foreach_ll(struct lws *, w,
					     nwsi->mux.child_list) {
				lwsl_info("%s: adi child tc cr %d +%d -> %d",
					  __func__, (int)w->txc.tx_cr,
					  b - (unsigned int)settings->s[a],
					  (int)(w->txc.tx_cr + (int)b -
						  (int)settings->s[a]));
				w->txc.tx_cr += (int)b - (int)settings->s[a];
				if (w->txc.tx_cr > 0 &&
				    w->txc.tx_cr <=
						  (int32_t)(b - settings->s[a]))

					lws_callback_on_writable(w);
			} lws_end_foreach_ll(w, mux.sibling_list);

			break;
		case H2SET_MAX_FRAME_SIZE:
			if (b < wsi->a.vhost->h2.set.s[H2SET_MAX_FRAME_SIZE]) {
				lws_h2_goaway(nwsi, H2_ERR_PROTOCOL_ERROR,
					      "Frame size < initial");
				return 1;
			}
			if (b > 0x00ffffff) {
				lws_h2_goaway(nwsi, H2_ERR_PROTOCOL_ERROR,
					      "Settings Frame size above max");
				return 1;
			}
			break;
		case H2SET_MAX_HEADER_LIST_SIZE:
			break;
		}
		settings->s[a] = b;
		lwsl_info("http2 settings %d <- 0x%x\n", a, b);
skip:
		len -= LWS_H2_SETTINGS_LEN;
		buf += LWS_H2_SETTINGS_LEN;
	}

	if (len)
		return 1;

	lws_h2_dump_settings(settings);

	return 0;
}